

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

void __thiscall
cmFileCommand::AddEvaluationFile
          (cmFileCommand *this,string *inputName,string *outputExpr,string *condition,
          bool inputIsContent)

{
  undefined8 uVar1;
  cmGlobalGenerator *this_00;
  cmCompiledGeneratorExpression *x;
  cmGeneratorExpression conditionGe;
  auto_ptr<cmCompiledGeneratorExpression> outputCge;
  auto_ptr<cmCompiledGeneratorExpression> conditionCge;
  cmGeneratorExpression outputGe;
  cmListFileBacktrace lfbt;
  undefined1 local_98 [16];
  undefined1 local_88 [8];
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  cmListFileBacktrace local_60;
  
  cmMakefile::GetBacktrace(&local_60,(this->super_cmCommand).Makefile);
  cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_80,&local_60);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_98,(string *)local_80);
  local_98._8_8_ = local_98._0_8_;
  local_98._0_8_ = (cmListFileBacktrace *)0x0;
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)local_98);
  cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_98,&local_60);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)(local_70 + 8),(string *)local_98);
  uVar1 = local_70._8_8_;
  local_70._8_8_ = 0;
  local_88 = (undefined1  [8])uVar1;
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)(local_70 + 8));
  this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
  local_70._0_8_ = local_98._8_8_;
  local_98._8_8_ = 0;
  local_88 = (undefined1  [8])0x0;
  local_80._8_8_ = uVar1;
  cmGlobalGenerator::AddEvaluationFile
            (this_00,inputName,(auto_ptr<cmCompiledGeneratorExpression> *)local_70,
             (this->super_cmCommand).Makefile,
             (auto_ptr<cmCompiledGeneratorExpression> *)(local_80 + 8),inputIsContent);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)(local_80 + 8));
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)local_70);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)local_88);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_98);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)(local_98 + 8));
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_80);
  std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
            (&local_60.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>);
  return;
}

Assistant:

void cmFileCommand::AddEvaluationFile(const std::string &inputName,
                                      const std::string &outputExpr,
                                      const std::string &condition,
                                      bool inputIsContent
                                     )
{
  cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();

  cmGeneratorExpression outputGe(&lfbt);
  cmsys::auto_ptr<cmCompiledGeneratorExpression> outputCge
                                                = outputGe.Parse(outputExpr);

  cmGeneratorExpression conditionGe(&lfbt);
  cmsys::auto_ptr<cmCompiledGeneratorExpression> conditionCge
                                              = conditionGe.Parse(condition);

  this->Makefile->GetGlobalGenerator()->AddEvaluationFile(inputName,
                                                          outputCge,
                                                          this->Makefile,
                                                          conditionCge,
                                                          inputIsContent);
}